

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

bool __thiscall
Catch::TeamCityReporter::assertionEnded(TeamCityReporter *this,AssertionStats *assertionStats)

{
  OfType OVar1;
  TestCaseInfo *pTVar2;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar3;
  size_t sVar4;
  long lVar5;
  ostream *poVar6;
  ulong uVar7;
  pointer pMVar8;
  MessageInfo *messageInfo;
  pointer pMVar9;
  char *pcVar10;
  ReusableStringStream msg;
  char local_a9;
  TeamCityReporter *local_a8;
  string local_a0;
  string local_80;
  char local_60;
  undefined7 uStack_5f;
  string *local_58;
  long local_50 [2];
  ReusableStringStream local_40;
  
  if ((((assertionStats->assertionResult).m_resultData.resultType & FailureBit) == Ok) ||
     (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0))
  goto LAB_0019f218;
  pSVar3 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar4 = StringStreams::add(&pSVar3->super_StringStreams);
  local_40.m_index = sVar4;
  pSVar3 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  poVar6 = (ostream *)
           (pSVar3->super_StringStreams).m_streams.
           super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar4].m_ptr;
  local_a8 = this;
  local_40.m_oss = poVar6;
  if (this->m_headerPrintedForThisSection == false) {
    printSectionHeader(this,poVar6);
  }
  local_a8->m_headerPrintedForThisSection = true;
  local_a0._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
  local_a0._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
  operator<<(poVar6,(SourceLineInfo *)&local_a0);
  local_80._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_80,1);
  OVar1 = (assertionStats->assertionResult).m_resultData.resultType;
  uVar7 = (ulong)(uint)OVar1;
  if (OVar1 < ThrewException) {
    if (FailureBit < OVar1) {
      if (OVar1 == ExpressionFailed) {
        pcVar10 = "expression failed";
      }
      else {
        if (OVar1 != ExplicitFailure) {
          if (OVar1 == Exception) goto LAB_0019eda2;
          goto LAB_0019ee27;
        }
        uVar7 = 0x10;
        pcVar10 = "explicit failure";
      }
      goto LAB_0019ee1f;
    }
    if ((uint)OVar1 < 3) {
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_80);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_80._M_string_length,"Internal error in TeamCity reporter",0x23);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_a0);
    }
    if ((OVar1 == Unknown) || (OVar1 == FailureBit)) {
LAB_0019eda2:
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_80);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_80._M_string_length,"Not implemented",0xf);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_a0);
    }
  }
  else {
    if (OVar1 == ThrewException) {
      uVar7 = 0x14;
      pcVar10 = "unexpected exception";
    }
    else if (OVar1 == DidntThrowException) {
      uVar7 = 0x2e;
      pcVar10 = "no exception was thrown where one was expected";
    }
    else {
      if (OVar1 != FatalErrorCondition) goto LAB_0019ee27;
      uVar7 = 0x15;
      pcVar10 = "fatal error condition";
    }
LAB_0019ee1f:
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar10,uVar7);
  }
LAB_0019ee27:
  pMVar9 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar8 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)pMVar8 - (long)pMVar9;
  if (lVar5 == 0x48) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," with message:",0xe);
    pMVar9 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar8 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar5 = (long)pMVar8 - (long)pMVar9;
  }
  if (1 < (ulong)((lVar5 >> 3) * -0x71c71c71c71c71c7)) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," with messages:",0xf);
    pMVar9 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar8 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (pMVar9 != pMVar8) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n  \"",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(pMVar9->message)._M_dataplus._M_p,(pMVar9->message)._M_string_length);
      local_a0._M_dataplus._M_p._0_1_ = 0x22;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_a0,1);
      pMVar9 = pMVar9 + 1;
    } while (pMVar9 != pMVar8);
  }
  if ((assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n  ",3);
    AssertionResult::getExpressionInMacro_abi_cxx11_(&local_a0,&assertionStats->assertionResult);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nwith expansion:\n  ",0x13);
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_80,&assertionStats->assertionResult);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                       local_80._M_dataplus._M_p._0_1_),local_80._M_string_length);
    local_60 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_60,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) !=
        &local_80.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_),
                      local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((((local_a8->super_StreamingReporterBase).currentTestCaseInfo)->properties &
      (MayFail|ShouldFail)) == None) {
    poVar6 = (local_a8->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"##teamcity[testFailed",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," name=\'",7);
    pTVar2 = (local_a8->super_StreamingReporterBase).currentTestCaseInfo;
    anon_unknown_23::escape
              (&local_a0,(anon_unknown_23 *)(pTVar2->name)._M_dataplus._M_p,
               (string *)(pTVar2->name)._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    local_80._M_dataplus._M_p._0_1_ = 0x27;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_80,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," message=\'",10);
    std::__cxx11::stringbuf::str();
    anon_unknown_23::escape(&local_80,(anon_unknown_23 *)CONCAT71(uStack_5f,local_60),local_58);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                                local_80._M_dataplus._M_p._0_1_),
                        local_80._M_string_length);
    local_a9 = '\'';
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_a9,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]\n",2);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"- failure ignore as test marked as \'ok to fail\'\n",0x30);
    poVar6 = (local_a8->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"##teamcity[testIgnored",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," name=\'",7);
    pTVar2 = (local_a8->super_StreamingReporterBase).currentTestCaseInfo;
    anon_unknown_23::escape
              (&local_a0,(anon_unknown_23 *)(pTVar2->name)._M_dataplus._M_p,
               (string *)(pTVar2->name)._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    local_80._M_dataplus._M_p._0_1_ = 0x27;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_80,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," message=\'",10);
    std::__cxx11::stringbuf::str();
    anon_unknown_23::escape(&local_80,(anon_unknown_23 *)CONCAT71(uStack_5f,local_60),local_58);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                                local_80._M_dataplus._M_p._0_1_),
                        local_80._M_string_length);
    local_a9 = '\'';
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_a9,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]\n",2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) !=
      &local_80.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_),
                    local_80.field_2._M_allocated_capacity + 1);
  }
  if ((long *)CONCAT71(uStack_5f,local_60) != local_50) {
    operator_delete((long *)CONCAT71(uStack_5f,local_60),local_50[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  ReusableStringStream::~ReusableStringStream(&local_40);
LAB_0019f218:
  std::ostream::flush();
  return true;
}

Assistant:

bool TeamCityReporter::assertionEnded(AssertionStats const &assertionStats) {
        AssertionResult const &result = assertionStats.assertionResult;
        if (!result.isOk()) {

            ReusableStringStream msg;
            if (!m_headerPrintedForThisSection)
                printSectionHeader(msg.get());
            m_headerPrintedForThisSection = true;

            msg << result.getSourceInfo() << '\n';

            switch (result.getResultType()) {
            case ResultWas::ExpressionFailed:
                msg << "expression failed";
                break;
            case ResultWas::ThrewException:
                msg << "unexpected exception";
                break;
            case ResultWas::FatalErrorCondition:
                msg << "fatal error condition";
                break;
            case ResultWas::DidntThrowException:
                msg << "no exception was thrown where one was expected";
                break;
            case ResultWas::ExplicitFailure:
                msg << "explicit failure";
                break;

                // We shouldn't get here because of the isOk() test
            case ResultWas::Ok:
            case ResultWas::Info:
            case ResultWas::Warning:
                CATCH_ERROR("Internal error in TeamCity reporter");
                // These cases are here to prevent compiler warnings
            case ResultWas::Unknown:
            case ResultWas::FailureBit:
            case ResultWas::Exception:
                CATCH_ERROR("Not implemented");
            }
            if (assertionStats.infoMessages.size() == 1)
                msg << " with message:";
            if (assertionStats.infoMessages.size() > 1)
                msg << " with messages:";
            for (auto const &messageInfo : assertionStats.infoMessages)
                msg << "\n  \"" << messageInfo.message << '"';


            if (result.hasExpression()) {
                msg <<
                    "\n  " << result.getExpressionInMacro() << "\n"
                    "with expansion:\n"
                    "  " << result.getExpandedExpression() << '\n';
            }

            if (currentTestCaseInfo->okToFail()) {
                msg << "- failure ignore as test marked as 'ok to fail'\n";
                stream << "##teamcity[testIgnored"
                    << " name='" << escape(currentTestCaseInfo->name) << '\''
                    << " message='" << escape(msg.str()) << '\''
                    << "]\n";
            }
            else {
                stream << "##teamcity[testFailed"
                    << " name='" << escape(currentTestCaseInfo->name) << '\''
                    << " message='" << escape(msg.str()) << '\''
                    << "]\n";
            }
        }
        stream.flush();
        return true;
    }